

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor.cpp
# Opt level: O0

bool __thiscall booster::aio::base_fast_reactor::check(base_fast_reactor *this,int fd,int *error)

{
  size_type sVar1;
  undefined4 *in_RDX;
  int in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar2;
  
  if (in_ESI < 0) {
    *in_RDX = 0x16;
    bVar2 = false;
  }
  else {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RDI);
    if ((int)sVar1 <= in_ESI) {
      std::vector<int,_std::allocator<int>_>::resize
                (unaff_retaddr,CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                 (value_type_conflict *)in_RDI);
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool check(int fd,int &error)
		{
			if(fd < 0) {
				error=EINVAL;
				return false;
			}
			if(fd >= int(events_.size())) {
				events_.resize(fd+1,0);
			}
			return true;
		}